

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

double __thiscall
duckdb::Interpolator<false>::
Operation<unsigned_long,double,duckdb::QuantileComposed<duckdb::MadAccessor<double,double,double>,duckdb::QuantileIndirect<double>>>
          (Interpolator<false> *this,unsigned_long *v_t,Vector *result,
          QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>
          *accessor)

{
  idx_t iVar1;
  idx_t iVar2;
  idx_t iVar3;
  MadAccessor<double,_double,_double> *pMVar4;
  CURSOR *pCVar5;
  ColumnDataScanState *pCVar6;
  long lVar7;
  double dVar8;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>_>_>
  __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>_>_>
  __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>_>_>
  __comp_01;
  bool bVar9;
  ulong uVar10;
  reference pvVar11;
  InvalidInputException *pIVar12;
  duckdb *pdVar13;
  double result_1;
  string local_80;
  double local_60;
  MadAccessor<double,_double,_double> *local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  bVar9 = this->desc;
  iVar1 = this->FRN;
  iVar2 = this->begin;
  iVar3 = this->end;
  local_80._M_dataplus._M_p = (pointer)accessor;
  local_80._M_string_length = (size_type)accessor;
  local_80.field_2._M_local_buf[0] = bVar9;
  if (this->CRN == iVar1) {
    if (iVar1 != iVar3 && iVar2 != iVar3) {
      uVar10 = (long)(iVar3 * 8 + iVar2 * -8) >> 3;
      lVar7 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_80.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar9;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,double,double>,duckdb::QuantileIndirect<double>>>>>
                (v_t + iVar2,v_t + iVar1,v_t + iVar3,(ulong)(((uint)lVar7 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
    }
    pMVar4 = accessor->outer;
    pCVar5 = accessor->inner->data;
    pCVar6 = (ColumnDataScanState *)v_t[this->FRN];
    if (((ColumnDataScanState *)(pCVar5->scan).next_row_index <= pCVar6) ||
       (pCVar6 < (ColumnDataScanState *)(pCVar5->scan).current_row_index)) {
      duckdb::ColumnDataCollection::Seek((ulong)pCVar5->inputs,pCVar6,(DataChunk *)&pCVar5->scan);
      pvVar11 = vector<duckdb::Vector,_true>::operator[]
                          ((vector<duckdb::Vector,_true> *)&pCVar5->page,0);
      pCVar5->data = *(double **)(pvVar11 + 0x20);
      pvVar11 = vector<duckdb::Vector,_true>::operator[]
                          ((vector<duckdb::Vector,_true> *)&pCVar5->page,0);
      FlatVector::VerifyFlatVector(pvVar11);
      pCVar5->validity = (ValidityMask *)(pvVar11 + 0x28);
    }
    local_58 = (MadAccessor<double,_double,_double> *)
               ABS(pCVar5->data[(uint)((int)pCVar6 - (int)(pCVar5->scan).current_row_index)] -
                   *pMVar4->median);
    uStack_50 = 0;
    pdVar13 = (duckdb *)0x0;
    bVar9 = duckdb::TryCast::Operation<double,double>((double)local_58,&local_60,false);
    if (!bVar9) {
      pIVar12 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,double>(&local_80,pdVar13,(double)local_58);
      duckdb::InvalidInputException::InvalidInputException(pIVar12,(string *)&local_80);
      __cxa_throw(pIVar12,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if (iVar1 != iVar3 && iVar2 != iVar3) {
      uVar10 = (long)(iVar3 * 8 + iVar2 * -8) >> 3;
      lVar7 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_80.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar9;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,double,double>,duckdb::QuantileIndirect<double>>>>>
                (v_t + iVar2,v_t + iVar1,v_t + iVar3,(ulong)(((uint)lVar7 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
    }
    iVar1 = this->FRN;
    iVar2 = this->end;
    local_80._M_dataplus._M_p = (pointer)accessor;
    local_80._M_string_length = (size_type)accessor;
    local_80.field_2._M_local_buf[0] = bVar9;
    if (this->CRN != iVar2 && iVar1 != iVar2) {
      uVar10 = (long)(iVar2 * 8 + iVar1 * -8) >> 3;
      lVar7 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_80.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar9;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,double,double>,duckdb::QuantileIndirect<double>>>>>
                (v_t + iVar1,v_t + this->CRN,v_t + iVar2,(ulong)(((uint)lVar7 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
    }
    local_58 = accessor->outer;
    pCVar5 = accessor->inner->data;
    pCVar6 = (ColumnDataScanState *)v_t[this->FRN];
    if (((ColumnDataScanState *)(pCVar5->scan).next_row_index <= pCVar6) ||
       (pCVar6 < (ColumnDataScanState *)(pCVar5->scan).current_row_index)) {
      duckdb::ColumnDataCollection::Seek((ulong)pCVar5->inputs,pCVar6,(DataChunk *)&pCVar5->scan);
      pvVar11 = vector<duckdb::Vector,_true>::operator[]
                          ((vector<duckdb::Vector,_true> *)&pCVar5->page,0);
      pCVar5->data = *(double **)(pvVar11 + 0x20);
      pvVar11 = vector<duckdb::Vector,_true>::operator[]
                          ((vector<duckdb::Vector,_true> *)&pCVar5->page,0);
      FlatVector::VerifyFlatVector(pvVar11);
      pCVar5->validity = (ValidityMask *)(pvVar11 + 0x28);
    }
    local_58 = (MadAccessor<double,_double,_double> *)
               ABS(pCVar5->data[(uint)((int)pCVar6 - (int)(pCVar5->scan).current_row_index)] -
                   *local_58->median);
    uStack_50 = 0;
    pdVar13 = (duckdb *)0x0;
    bVar9 = duckdb::TryCast::Operation<double,double>((double)local_58,&local_60,false);
    if (!bVar9) {
      pIVar12 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,double>(&local_80,pdVar13,(double)local_58);
      duckdb::InvalidInputException::InvalidInputException(pIVar12,(string *)&local_80);
      __cxa_throw(pIVar12,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    local_58 = (MadAccessor<double,_double,_double> *)local_60;
    pMVar4 = accessor->outer;
    pCVar5 = accessor->inner->data;
    pCVar6 = (ColumnDataScanState *)v_t[this->CRN];
    if (((ColumnDataScanState *)(pCVar5->scan).next_row_index <= pCVar6) ||
       (pCVar6 < (ColumnDataScanState *)(pCVar5->scan).current_row_index)) {
      duckdb::ColumnDataCollection::Seek((ulong)pCVar5->inputs,pCVar6,(DataChunk *)&pCVar5->scan);
      pvVar11 = vector<duckdb::Vector,_true>::operator[]
                          ((vector<duckdb::Vector,_true> *)&pCVar5->page,0);
      pCVar5->data = *(double **)(pvVar11 + 0x20);
      pvVar11 = vector<duckdb::Vector,_true>::operator[]
                          ((vector<duckdb::Vector,_true> *)&pCVar5->page,0);
      FlatVector::VerifyFlatVector(pvVar11);
      pCVar5->validity = (ValidityMask *)(pvVar11 + 0x28);
    }
    local_48 = ABS(pCVar5->data[(uint)((int)pCVar6 - (int)(pCVar5->scan).current_row_index)] -
                   *pMVar4->median);
    uStack_40 = 0;
    pdVar13 = (duckdb *)0x0;
    bVar9 = duckdb::TryCast::Operation<double,double>(local_48,&local_60,false);
    if (!bVar9) {
      pIVar12 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,double>(&local_80,pdVar13,local_48);
      duckdb::InvalidInputException::InvalidInputException(pIVar12,(string *)&local_80);
      __cxa_throw(pIVar12,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    dVar8 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_60 = dVar8 * local_60 + (double)local_58 * (1.0 - dVar8);
  }
  return local_60;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}